

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262.c
# Opt level: O3

int h262_seqparm(bitstream *str,h262_seqparm *seqparm)

{
  int iVar1;
  long lVar2;
  uint32_t vbv;
  uint32_t br;
  uint32_t vs;
  uint32_t hs;
  uint32_t local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  
  local_2c = seqparm->horizontal_size & 0xfff;
  local_30 = seqparm->vertical_size & 0xfff;
  local_34 = seqparm->bit_rate & 0x3ffff;
  local_38 = seqparm->vbv_buffer_size & 0x3ff;
  if ((str->dir == VS_ENCODE) && (seqparm->is_ext == 0)) {
    if (0xfff < seqparm->horizontal_size) {
      h262_seqparm_cold_1();
      return 1;
    }
    if (0xfff < seqparm->vertical_size) {
      h262_seqparm_cold_2();
      return 1;
    }
    if (0x3ffff < seqparm->bit_rate) {
      h262_seqparm_cold_3();
      return 1;
    }
    if (0x3ff < seqparm->vbv_buffer_size) {
      h262_seqparm_cold_4();
      return 1;
    }
  }
  iVar1 = vs_u(str,&local_2c,0xc);
  if (iVar1 != 0) {
    return 1;
  }
  iVar1 = vs_u(str,&local_30,0xc);
  if (iVar1 != 0) {
    return 1;
  }
  iVar1 = vs_u(str,&seqparm->aspect_ratio_information,4);
  if (iVar1 != 0) {
    return 1;
  }
  iVar1 = vs_u(str,&seqparm->frame_rate_code,4);
  if (iVar1 != 0) {
    return 1;
  }
  iVar1 = vs_u(str,&local_34,0x12);
  if (iVar1 != 0) {
    return 1;
  }
  iVar1 = vs_mark(str,1,1);
  if (iVar1 != 0) {
    return 1;
  }
  iVar1 = vs_u(str,&local_38,10);
  if (iVar1 != 0) {
    return 1;
  }
  iVar1 = vs_u(str,&seqparm->constrained_parameters_flag,1);
  if (iVar1 != 0) {
    return 1;
  }
  iVar1 = vs_u(str,&seqparm->load_intra_quantiser_matrix,1);
  if (iVar1 != 0) {
    return 1;
  }
  if (seqparm->load_intra_quantiser_matrix != 0) {
    lVar2 = 0;
    do {
      iVar1 = vs_u(str,(uint32_t *)((long)seqparm->intra_quantiser_matrix + lVar2),8);
      if (iVar1 != 0) {
        return 1;
      }
      lVar2 = lVar2 + 4;
    } while (lVar2 != 0x100);
  }
  iVar1 = vs_u(str,&seqparm->load_non_intra_quantiser_matrix,1);
  if (iVar1 != 0) {
    return 1;
  }
  if (seqparm->load_non_intra_quantiser_matrix != 0) {
    lVar2 = 0;
    do {
      iVar1 = vs_u(str,(uint32_t *)((long)seqparm->non_intra_quantiser_matrix + lVar2),8);
      if (iVar1 != 0) {
        return 1;
      }
      lVar2 = lVar2 + 4;
    } while (lVar2 != 0x100);
  }
  if (str->dir == VS_DECODE) {
    seqparm->horizontal_size = local_2c;
    seqparm->vertical_size = local_30;
    seqparm->bit_rate = local_34;
    seqparm->vbv_buffer_size = local_38;
    seqparm->is_ext = 0;
    seqparm->has_disp_ext = 0;
  }
  else if (seqparm->is_ext != 0) {
    return 0;
  }
  iVar1 = vs_infer(str,&seqparm->progressive_sequence,1);
  if (iVar1 == 0) {
    iVar1 = vs_infer(str,&seqparm->chroma_format,1);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = vs_infer(str,&seqparm->low_delay,0);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = vs_infer(str,&seqparm->low_delay,0);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = vs_infer(str,&seqparm->frame_rate_extension_n,0);
    if (iVar1 == 0) {
      iVar1 = vs_infer(str,&seqparm->frame_rate_extension_d,0);
      if (iVar1 == 0) {
        return 0;
      }
      return 1;
    }
    return 1;
  }
  return 1;
}

Assistant:

int h262_seqparm(struct bitstream *str, struct h262_seqparm *seqparm) {
	uint32_t hs = seqparm->horizontal_size & 0xfff;
	uint32_t vs = seqparm->vertical_size & 0xfff;
	uint32_t br = seqparm->bit_rate & 0x3ffff;
	uint32_t vbv = seqparm->vbv_buffer_size & 0x3ff;
	int i;
	if (str->dir == VS_ENCODE && !seqparm->is_ext) {
		if (hs != seqparm->horizontal_size) {
			fprintf(stderr, "horizontal_size too big for MPEG1\n");
			return 1;
		}
		if (vs != seqparm->vertical_size) {
			fprintf(stderr, "vertical_size too big for MPEG1\n");
			return 1;
		}
		if (br != seqparm->bit_rate) {
			fprintf(stderr, "bit_rate too big for MPEG1\n");
			return 1;
		}
		if (vbv != seqparm->vbv_buffer_size) {
			fprintf(stderr, "vbv_buffer_size too big for MPEG1\n");
			return 1;
		}
	}
	if (vs_u(str, &hs, 12)) return 1;
	if (vs_u(str, &vs, 12)) return 1;
	if (vs_u(str, &seqparm->aspect_ratio_information, 4)) return 1;
	if (vs_u(str, &seqparm->frame_rate_code, 4)) return 1;
	if (vs_u(str, &br, 18)) return 1;
	if (vs_mark(str, 1, 1)) return 1;
	if (vs_u(str, &vbv, 10)) return 1;
	if (vs_u(str, &seqparm->constrained_parameters_flag, 1)) return 1;
	if (vs_u(str, &seqparm->load_intra_quantiser_matrix, 1)) return 1;
	if (seqparm->load_intra_quantiser_matrix) {
		for (i = 0; i < 64; i++)
			if (vs_u(str, &seqparm->intra_quantiser_matrix[i], 8)) return 1;
	}
	if (vs_u(str, &seqparm->load_non_intra_quantiser_matrix, 1)) return 1;
	if (seqparm->load_non_intra_quantiser_matrix) {
		for (i = 0; i < 64; i++)
			if (vs_u(str, &seqparm->non_intra_quantiser_matrix[i], 8)) return 1;
	}
	if (str->dir == VS_DECODE) {
		seqparm->horizontal_size = hs;
		seqparm->vertical_size = vs;
		seqparm->bit_rate = br;
		seqparm->vbv_buffer_size = vbv;
		seqparm->is_ext = 0;
		seqparm->has_disp_ext = 0;
	}
	if (!seqparm->is_ext) {
		if (vs_infer(str, &seqparm->progressive_sequence, 1)) return 1;
		if (vs_infer(str, &seqparm->chroma_format, 1)) return 1;
		if (vs_infer(str, &seqparm->low_delay, 0)) return 1;
		if (vs_infer(str, &seqparm->low_delay, 0)) return 1;
		if (vs_infer(str, &seqparm->frame_rate_extension_n, 0)) return 1;
		if (vs_infer(str, &seqparm->frame_rate_extension_d, 0)) return 1;
	}
	return 0;
}